

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStructGet(TranslateToFuzzReader *this,Type type)

{
  ulong uVar1;
  bool signed_;
  mapped_type *vec;
  value_type *pvVar2;
  Expression *ref;
  long *plVar3;
  StructGet *pSVar4;
  Index IStack_30;
  key_type local_28;
  Type type_local;
  
  local_28.id = type.id;
  vec = std::__detail::
        _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)&this->typeStructFields,&local_28);
  if ((vec->
      super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (vec->
      super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pvVar2 = Random::
             pick<std::vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
                       (&this->random,vec);
    uVar1 = *(ulong *)&pvVar2->second;
    ref = makeTrappingRefUse(this,(HeapType)(pvVar2->first).id);
    plVar3 = (long *)::wasm::HeapType::getStruct();
    signed_ = maybeSignedGet(this,(Field *)((uVar1 & 0xffffffff) * 0x10 + *plVar3));
    IStack_30 = (Index)uVar1;
    pSVar4 = Builder::makeStructGet
                       (&this->builder,IStack_30,ref,Unordered,(Type)local_28.id,signed_);
    return (Expression *)pSVar4;
  }
  __assert_fail("!structFields.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x1360,"Expression *wasm::TranslateToFuzzReader::makeStructGet(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeStructGet(Type type) {
  auto& structFields = typeStructFields[type];
  assert(!structFields.empty());
  auto [structType, fieldIndex] = pick(structFields);
  auto* ref = makeTrappingRefUse(structType);
  auto signed_ = maybeSignedGet(structType.getStruct().fields[fieldIndex]);
  return builder.makeStructGet(
    fieldIndex, ref, MemoryOrder::Unordered, type, signed_);
}